

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void __thiscall ExpressionContext::AddAlias(ExpressionContext *this,AliasData *alias)

{
  ScopeData *pSVar1;
  undefined1 auVar2 [16];
  AliasData *local_10;
  
  local_10 = alias;
  SmallArray<AliasData_*,_2U>::push_back(&this->scope->aliases,&local_10);
  pSVar1 = this->scope;
  if (pSVar1->type == SCOPE_NAMESPACE) {
    pSVar1 = this->globalScope;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_10;
  DirectChainedMap<TypeLookupResult>::insert
            (&pSVar1->typeLookupMap,local_10->nameHash,(TypeLookupResult)(auVar2 << 0x40));
  return;
}

Assistant:

void ExpressionContext::AddAlias(AliasData *alias)
{
	scope->aliases.push_back(alias);

	// Namespaces are allowed only in global scope and namespaced alias names are globally accessible through namespace name
	if(scope->type == SCOPE_NAMESPACE)
		globalScope->typeLookupMap.insert(alias->nameHash, TypeLookupResult(alias));
	else
		scope->typeLookupMap.insert(alias->nameHash, TypeLookupResult(alias));
}